

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int fits_iter_set_by_name(iteratorCol *col,fitsfile *fptr,char *colname,int datatype,int iotype)

{
  undefined4 in_ECX;
  char *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  
  *in_RDI = in_RSI;
  strncpy((char *)((long)in_RDI + 0xc),in_RDX,0x45);
  *(undefined1 *)((long)in_RDI + 0x51) = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = in_ECX;
  *(undefined4 *)(in_RDI + 0xb) = in_R8D;
  return 0;
}

Assistant:

int fits_iter_set_by_name(iteratorCol *col, /* I - iterator col structure */
           fitsfile *fptr,  /* I - FITS file pointer                      */
           char *colname,   /* I - column name                            */
           int datatype,    /* I - column datatype                        */
           int iotype)      /* I - InputCol, InputOutputCol, or OutputCol */
/*
  set all the parameters for an iterator column, by column name
*/
{
    col->fptr = fptr;
    strncpy(col->colname, colname,69);
    col->colname[69]=0;
    col->colnum = 0;  /* set column number undefined since name is given */
    col->datatype = datatype;
    col->iotype = iotype;
    return(0);
}